

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t *
Acb_FindSupport(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Int_t *vSuppStart,int TimeOut
               )

{
  Vec_Wrd_t *__ptr;
  int iVar1;
  uint uVar2;
  int *__dest;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vSupp;
  long lVar4;
  uint uVar5;
  long lVar6;
  Vec_Wrd_t *vPats;
  int nPats;
  timespec ts;
  uint local_74;
  Vec_Int_t *local_70;
  Vec_Wrd_t *local_60;
  int local_54;
  sat_solver *local_50;
  uint local_44;
  timespec local_40;
  
  local_50 = pSat;
  local_44 = TimeOut;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  local_60 = (Vec_Wrd_t *)0x0;
  local_54 = 0;
  local_74 = Acb_ComputeSuppCost(vSuppStart,vWeights,iFirstDiv);
  local_70 = (Vec_Int_t *)malloc(0x10);
  iVar1 = vSuppStart->nSize;
  lVar4 = (long)iVar1;
  local_70->nSize = iVar1;
  local_70->nCap = iVar1;
  if (lVar4 == 0) {
    __dest = (int *)0x0;
  }
  else {
    __dest = (int *)malloc(lVar4 * 4);
  }
  local_70->pArray = __dest;
  memcpy(__dest,vSuppStart->pArray,lVar4 << 2);
  printf("Starting cost = %d.\n",(ulong)local_74);
  uVar5 = 0;
  do {
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    if (lVar6 + (long)TimeOut * 1000000 < lVar4) {
      printf("Timeout after %d sec.\n",(ulong)local_44);
      break;
    }
    if (uVar5 == 0) {
      pVVar3 = Acb_FindSupportStart(local_50,iFirstDiv,vWeights,&local_60,&local_54);
    }
    else {
      pVVar3 = Acb_FindSupportNext(local_50,iFirstDiv,vWeights,local_60,&local_54);
    }
    if (pVVar3 == (Vec_Int_t *)0x0) break;
    vSupp = Acb_FindSupportMin(local_50,iFirstDiv,local_60,&local_54,pVVar3);
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    free(pVVar3);
    if (vSupp == (Vec_Int_t *)0x0) break;
    uVar2 = Acb_ComputeSuppCost(vSupp,vWeights,iFirstDiv);
    pVVar3 = vSupp;
    if ((int)uVar2 < (int)local_74) {
      printf("Iter %4d:  Next cost = %5d.  ",(ulong)uVar5,(ulong)uVar2);
      puts("Updating best solution.");
      pVVar3 = local_70;
      local_74 = uVar2;
      local_70 = vSupp;
    }
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 500);
  __ptr = local_60;
  if (local_60 != (Vec_Wrd_t *)0x0) {
    Acb_FindReplace(local_50,iFirstDiv,vWeights,local_60,local_54,local_70);
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (word *)0x0;
    }
    free(__ptr);
  }
  return local_70;
}

Assistant:

Vec_Int_t * Acb_FindSupport( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Int_t * vSuppStart, int TimeOut )
{
    abctime clkLimit = TimeOut * CLOCKS_PER_SEC + Abc_Clock();
    Vec_Wrd_t * vPats = NULL;
    int nPats = 0;
    Vec_Int_t * vSuppBest, * vSupp, * vTemp;
    int CostBest, Cost;
    int Iter;

    // find initial best
    CostBest = Acb_ComputeSuppCost( vSuppStart, vWeights, iFirstDiv );
    vSuppBest = Vec_IntDup( vSuppStart );
    printf( "Starting cost = %d.\n", CostBest );

    // iteratively find the one with the most ones in the uncovered rows
    for ( Iter = 0; Iter < 500; Iter++ )
    {
        if ( Abc_Clock() > clkLimit )
        {
            printf( "Timeout after %d sec.\n", TimeOut );
            break;
        }
        if ( Iter == 0 )
            vSupp = Acb_FindSupportStart( pSat, iFirstDiv, vWeights, &vPats, &nPats );
        else
            vSupp = Acb_FindSupportNext( pSat, iFirstDiv, vWeights, vPats, &nPats );
        if ( vSupp == NULL )
            break;
        vSupp = Acb_FindSupportMin( pSat, iFirstDiv, vPats, &nPats, vTemp = vSupp );
        Vec_IntFree( vTemp );
        if ( vSupp == NULL )
            break;
        Cost = Acb_ComputeSuppCost( vSupp, vWeights, iFirstDiv );
        //Acb_PrintPatterns( vPats, nPats, vWeights );
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            ABC_SWAP( Vec_Int_t *, vSuppBest, vSupp );
            printf( "Iter %4d:  Next cost = %5d.  ", Iter, Cost );
            printf( "Updating best solution.\n" );
        }
        Vec_IntFree( vSupp );
    }
    if ( vPats )
        Acb_FindReplace( pSat, iFirstDiv, vWeights, vPats, nPats, vSuppBest );
    //printf( "Number of patterns = %d.\n", nPats );
    Vec_WrdFreeP( &vPats );
    return vSuppBest;
}